

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

format_arg * __thiscall
fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>::get_arg
          (basic_format_context<fmt::v5::internal::counting_iterator<char>,_char> *this,
          basic_string_view<char> name)

{
  basic_string_view<char> name_00;
  type tVar1;
  size_t in_RDX;
  context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
  *in_RSI;
  basic_format_arg<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
  *in_RDI;
  basic_format_arg<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
  *message;
  context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
  *this_00;
  EVP_PKEY_CTX local_28 [8];
  
  this_00 = in_RSI + 1;
  message = in_RDI;
  _local_28 = internal::
              context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
              ::args(in_RSI);
  internal::
  arg_map<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>::init
            ((arg_map<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
              *)this_00,local_28);
  name_00.size_ = in_RDX;
  name_00.data_ = (char *)in_RSI;
  internal::
  arg_map<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>::find
            ((arg_map<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
              *)local_28._8_8_.values_,name_00);
  tVar1 = basic_format_arg<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
          ::type(in_RDI);
  if (tVar1 == none_type) {
    internal::
    context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
    ::on_error(this_00,(char *)message);
  }
  return message;
}

Assistant:

typename basic_format_context<Range, Char>::format_arg
  basic_format_context<Range, Char>::get_arg(
    basic_string_view<char_type> name) {
  map_.init(this->args());
  format_arg arg = map_.find(name);
  if (arg.type() == internal::none_type)
    this->on_error("argument not found");
  return arg;
}